

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)

{
  fdb_status fVar1;
  list_elem *plVar2;
  list_elem *e;
  list_elem **__ptr;
  
  pthread_spin_lock(&root_handle->fhandle->lock);
  e = root_handle->fhandle->handles->head;
  while (e != (list_elem *)0x0) {
    plVar2 = list_remove(root_handle->fhandle->handles,e);
    fVar1 = _fdb_close((fdb_kvs_handle *)e[-1].next);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0012e092;
    __ptr = &e[-1].next;
    fdb_kvs_info_free((fdb_kvs_handle *)*__ptr);
    free(*__ptr);
    free(__ptr);
    e = plVar2;
  }
  fVar1 = FDB_RESULT_SUCCESS;
LAB_0012e092:
  pthread_spin_unlock(&root_handle->fhandle->lock);
  return fVar1;
}

Assistant:

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)
{
    fdb_status fs;
    struct list_elem *e;
    struct kvs_opened_node *node;

    spin_lock(&root_handle->fhandle->lock);
    e = list_begin(root_handle->fhandle->handles);
    while (e) {
        node = _get_entry(e, struct kvs_opened_node, le);
        e = list_remove(root_handle->fhandle->handles, &node->le);
        fs = _fdb_close(node->handle);
        if (fs != FDB_RESULT_SUCCESS) {
            spin_unlock(&root_handle->fhandle->lock);
            return fs;
        }
        fdb_kvs_info_free(node->handle);
        free(node->handle);
        free(node);
    }
    spin_unlock(&root_handle->fhandle->lock);

    return FDB_RESULT_SUCCESS;
}